

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.hpp
# Opt level: O0

void __thiscall Lib::Deque<Kernel::Clause_*>::expand(Deque<Kernel::Clause_*> *this)

{
  size_t sVar1;
  size_t sVar2;
  Clause **ppCVar3;
  Deque<Kernel::Clause_*> *in_RDI;
  size_t i;
  Clause **oldPtr;
  Clause **newData;
  void *mem;
  size_t newCapacity;
  size_t curSize;
  ulong local_38;
  Clause **local_30;
  
  sVar2 = size(in_RDI);
  sVar1 = in_RDI->_capacity;
  ppCVar3 = (Clause **)Lib::alloc((size_t)in_RDI);
  local_30 = in_RDI->_front;
  for (local_38 = 0; local_38 < sVar2; local_38 = local_38 + 1) {
    ppCVar3[local_38] = *local_30;
    local_30 = local_30 + 1;
    if (local_30 == in_RDI->_end) {
      local_30 = in_RDI->_data;
    }
  }
  Lib::free(in_RDI->_data);
  in_RDI->_data = ppCVar3;
  in_RDI->_front = in_RDI->_data;
  in_RDI->_back = in_RDI->_data + sVar2;
  in_RDI->_end = in_RDI->_data + sVar1 * 2;
  in_RDI->_capacity = sVar1 * 2;
  return;
}

Assistant:

void expand ()
  {
    ASS(shouldExpand());

    size_t curSize=size();
    size_t newCapacity = 2 * _capacity;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),"Deque<>");

    C* newData = static_cast<C*>(mem);
    C* oldPtr=_front;
    for(size_t i = 0; i<curSize; i++) {
      ::new (newData+i) C(*oldPtr);
      oldPtr->~C();

      oldPtr++;
      if(oldPtr==_end) {
	oldPtr=_data;
      }
    }
    ASS_EQ(oldPtr, _back);
    // deallocate the old stack
    DEALLOC_KNOWN(_data,_capacity*sizeof(C),"Deque<>");

    _data = newData;
    _front = _data;
    _back = _data + curSize;
    _end = _data + newCapacity;
    _capacity = newCapacity;
  }